

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall
cppnet::RWSocket::RWSocket(RWSocket *this,uint64_t sock,shared_ptr<cppnet::AlloterWrap> *alloter)

{
  element_type *peVar1;
  AlloterWrap local_60;
  AlloterWrap local_50 [2];
  AlloterWrap local_30;
  shared_ptr<cppnet::AlloterWrap> *local_20;
  shared_ptr<cppnet::AlloterWrap> *alloter_local;
  uint64_t sock_local;
  RWSocket *this_local;
  
  local_20 = alloter;
  alloter_local = (shared_ptr<cppnet::AlloterWrap> *)sock;
  sock_local = (uint64_t)this;
  Socket::Socket(&this->super_Socket,sock);
  CNSocket::CNSocket(&this->super_CNSocket);
  std::enable_shared_from_this<cppnet::RWSocket>::enable_shared_from_this
            (&this->super_enable_shared_from_this<cppnet::RWSocket>);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_0016a100;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&DAT_0016a1c0;
  this->_context = (void *)0x0;
  this->_timer_id = 0;
  this->_listen_port = 0;
  std::atomic<bool>::atomic(&this->_shutdown,false);
  std::atomic<bool>::atomic(&this->_connecting,false);
  this->_event = (Event *)0x0;
  std::shared_ptr<cppnet::BufferQueue>::shared_ptr(&this->_write_buffer);
  std::shared_ptr<cppnet::BufferQueue>::shared_ptr(&this->_read_buffer);
  std::shared_ptr<cppnet::AlloterWrap>::shared_ptr(&this->_alloter,alloter);
  std::shared_ptr<cppnet::BlockMemoryPool>::shared_ptr(&this->_block_pool);
  peVar1 = std::__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_alloter);
  AlloterWrap::PoolNewSharePtr<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>
            (&local_30,(unsigned_short *)peVar1,&__mem_block_size);
  std::shared_ptr<cppnet::BlockMemoryPool>::operator=
            (&this->_block_pool,(shared_ptr<cppnet::BlockMemoryPool> *)&local_30);
  std::shared_ptr<cppnet::BlockMemoryPool>::~shared_ptr
            ((shared_ptr<cppnet::BlockMemoryPool> *)&local_30);
  peVar1 = std::__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_alloter);
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            (local_50,(shared_ptr<cppnet::BlockMemoryPool> *)peVar1,
             (shared_ptr<cppnet::AlloterWrap> *)&this->_block_pool);
  std::shared_ptr<cppnet::BufferQueue>::operator=
            (&this->_write_buffer,(shared_ptr<cppnet::BufferQueue> *)local_50);
  std::shared_ptr<cppnet::BufferQueue>::~shared_ptr((shared_ptr<cppnet::BufferQueue> *)local_50);
  peVar1 = std::__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_alloter);
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            (&local_60,(shared_ptr<cppnet::BlockMemoryPool> *)peVar1,
             (shared_ptr<cppnet::AlloterWrap> *)&this->_block_pool);
  std::shared_ptr<cppnet::BufferQueue>::operator=
            (&this->_read_buffer,(shared_ptr<cppnet::BufferQueue> *)&local_60);
  std::shared_ptr<cppnet::BufferQueue>::~shared_ptr((shared_ptr<cppnet::BufferQueue> *)&local_60);
  return;
}

Assistant:

RWSocket::RWSocket(uint64_t sock, std::shared_ptr<AlloterWrap> alloter):
    Socket(sock),
    _context(nullptr),
    _timer_id(0),
    _listen_port(0),
    _shutdown(false),
    _connecting(false),
    _event(nullptr),
    _alloter(alloter) {

    _block_pool = _alloter->PoolNewSharePtr<BlockMemoryPool>(__mem_block_size, __mem_block_add_step);

    _write_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
    _read_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
}